

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::ByteSizeLong
          (BiDirectionalLSTMLayerParams *this)

{
  Rep *pRVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar9 = (long)(this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar9 == 0) {
    lVar9 = 0;
  }
  else {
    lVar10 = lVar9 * 8;
    lVar8 = 0;
    do {
      sVar4 = ActivationParams::ByteSizeLong(*(ActivationParams **)((long)ppvVar7 + lVar8));
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar9 = lVar9 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar10 - lVar8 != 0);
  }
  lVar10 = (long)(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  lVar9 = lVar9 + lVar10;
  pRVar1 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar10 != 0) {
    lVar8 = 0;
    do {
      sVar4 = ActivationParams::ByteSizeLong(*(ActivationParams **)((long)ppvVar7 + lVar8));
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar9 = lVar9 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar10 * 8 != lVar8);
  }
  lVar10 = (long)(this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->weightparams_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  sVar4 = lVar9 + lVar10 * 2;
  if (lVar10 != 0) {
    lVar9 = 0;
    do {
      sVar5 = LSTMWeightParams::ByteSizeLong(*(LSTMWeightParams **)((long)ppvVar7 + lVar9));
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar9 = lVar9 + 8;
    } while (lVar10 * 8 != lVar9);
  }
  if (this != (BiDirectionalLSTMLayerParams *)_BiDirectionalLSTMLayerParams_default_instance_ &&
      this->params_ != (LSTMParams *)0x0) {
    sVar5 = LSTMParams::ByteSizeLong(this->params_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->inputvectorsize_ != 0) {
    uVar6 = this->inputvectorsize_ | 1;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar9 * 9 + 0x89U >> 6);
  }
  if (this->outputvectorsize_ != 0) {
    uVar6 = this->outputvectorsize_ | 1;
    lVar9 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar9 * 9 + 0x89U >> 6);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar6 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

size_t BiDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  total_size += 1UL * this->_internal_activationsforwardlstm_size();
  for (const auto& msg : this->activationsforwardlstm_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  total_size += 1UL * this->_internal_activationsbackwardlstm_size();
  for (const auto& msg : this->activationsbackwardlstm_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  total_size += 2UL * this->_internal_weightparams_size();
  for (const auto& msg : this->weightparams_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *params_);
  }

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_outputvectorsize());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}